

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLayerComparer::operator()
          (ImageLayerComparer *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  LayeredImage *this_00;
  bool bVar1;
  TextureType TVar2;
  CubeFace CVar3;
  int width;
  int height;
  deUint32 value;
  char *pcVar4;
  TextureFormat *pTVar5;
  char *pcVar6;
  Vector<float,_4> local_180;
  undefined4 local_170;
  Vector<unsigned_int,_4> local_16c;
  byte local_159;
  string local_158;
  byte local_133;
  byte local_132;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string comparisonDesc;
  string local_c0;
  undefined1 local_a0 [8];
  string comparisonName;
  undefined1 local_58 [8];
  ConstPixelBufferAccess referenceSlice;
  bool isCube;
  int sliceOrFaceNdx_local;
  ConstPixelBufferAccess *resultSlice_local;
  TestLog *log_local;
  ImageLayerComparer *this_local;
  
  referenceSlice.m_data._4_4_ = sliceOrFaceNdx;
  TVar2 = LayeredImage::getImageType(this->m_reference);
  referenceSlice.m_data._3_1_ = TVar2 == TEXTURETYPE_CUBE;
  if ((bool)referenceSlice.m_data._3_1_) {
    this_00 = this->m_reference;
    CVar3 = glslImageFuncZToCubeFace(referenceSlice.m_data._4_4_);
    LayeredImage::getCubeFaceAccess
              ((ConstPixelBufferAccess *)((long)&comparisonName.field_2 + 8),this_00,CVar3);
  }
  else {
    LayeredImage::getSliceAccess
              ((ConstPixelBufferAccess *)((long)&comparisonName.field_2 + 8),this->m_reference,
               referenceSlice.m_data._4_4_);
  }
  width = tcu::Vector<int,_2>::x(&this->m_relevantRegion);
  height = tcu::Vector<int,_2>::y(&this->m_relevantRegion);
  tcu::getSubregion((ConstPixelBufferAccess *)local_58,
                    (ConstPixelBufferAccess *)((long)&comparisonName.field_2 + 8),0,0,width,height);
  de::toString<int>(&local_c0,(int *)((long)&referenceSlice.m_data + 4));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 "Comparison",&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  local_132 = 0;
  local_133 = 0;
  local_159 = 0;
  if ((referenceSlice.m_data._3_1_ & 1) == 0) {
    de::toString<int>(&local_158,(int *)((long)&referenceSlice.m_data + 4));
    local_159 = 1;
    std::operator+(&local_110,"slice ",&local_158);
  }
  else {
    CVar3 = glslImageFuncZToCubeFace(referenceSlice.m_data._4_4_);
    value = cubeFaceToGLFace(CVar3);
    pcVar4 = glu::getCubeMapFaceName(value);
    std::allocator<char>::allocator();
    local_132 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar4,&local_131);
    local_133 = 1;
    std::operator+(&local_110,"face ",&local_130);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 "Image Comparison, ",&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if ((local_159 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_158);
  }
  if ((local_133 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_130);
  }
  if ((local_132 & 1) != 0) {
    std::allocator<char>::~allocator(&local_131);
  }
  pTVar5 = LayeredImage::getFormat(this->m_reference);
  bVar1 = isFormatTypeInteger(pTVar5->type);
  if (bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    tcu::Vector<unsigned_int,_4>::Vector(&local_16c,0);
    this_local._7_1_ =
         tcu::intThresholdCompare
                   (log,pcVar4,pcVar6,(ConstPixelBufferAccess *)local_58,resultSlice,&local_16c,
                    COMPARE_LOG_RESULT);
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    tcu::Vector<float,_4>::Vector(&local_180,0.01);
    this_local._7_1_ =
         tcu::floatThresholdCompare
                   (log,pcVar4,pcVar6,(ConstPixelBufferAccess *)local_58,resultSlice,&local_180,
                    COMPARE_LOG_RESULT);
  }
  local_170 = 1;
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_a0);
  return this_local._7_1_;
}

Assistant:

bool operator() (TestLog& log, const tcu::ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool						isCube				= m_reference.getImageType() == TEXTURETYPE_CUBE;
		const ConstPixelBufferAccess	referenceSlice		= tcu::getSubregion(isCube ? m_reference.getCubeFaceAccess(glslImageFuncZToCubeFace(sliceOrFaceNdx))
																					   : m_reference.getSliceAccess(sliceOrFaceNdx),
																				0, 0, m_relevantRegion.x(), m_relevantRegion.y());

		const string comparisonName = "Comparison" + toString(sliceOrFaceNdx);
		const string comparisonDesc = "Image Comparison, "
									+ (isCube ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
											  : "slice " + toString(sliceOrFaceNdx));

		if (isFormatTypeInteger(m_reference.getFormat().type))
			return tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), referenceSlice, resultSlice, UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			return tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), referenceSlice, resultSlice, Vec4(0.01f), tcu::COMPARE_LOG_RESULT);
	}